

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

Var Js::JavascriptProxy::EntryRevocable(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  Entry *scriptContext_00;
  bool bVar2;
  int n;
  CallFlags CVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Recycler *pRVar6;
  RuntimeFunction *this_00;
  Var pvVar7;
  JavascriptLibrary *this_01;
  DynamicObject *object;
  DynamicObject *obj;
  TrackAllocData local_e0;
  RuntimeFunction *local_b8;
  RuntimeFunction *revoker;
  DynamicType *type;
  JavascriptLibrary *library;
  JavascriptProxy *local_90;
  JavascriptProxy *proxy;
  RecyclableObject *local_78;
  undefined1 local_70 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x75,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  local_78 = function_local;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_70,function,(CallInfo)function_local,
             L"Proxy.revocable",&stack0x00000000);
  if (((uint)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x79,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  CVar3 = Js::operator&((uint)scriptContext >> 0x18,CallFlags_New);
  scriptContext_00 = __tag.entry.next;
  if (CVar3 != CallFlags_None) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)__tag.entry.next,-0x7ff5ebf5,L"Proxy.revocable");
  }
  Arguments::Arguments((Arguments *)&library,(Arguments *)&scriptContext);
  local_90 = Create((ScriptContext *)scriptContext_00,(Arguments *)&library);
  type = (DynamicType *)ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
  revoker = (RuntimeFunction *)
            JavascriptLibrary::CreateFunctionWithConfigurableLengthType
                      ((JavascriptLibrary *)type,(FunctionInfo *)EntryInfo::Revoke);
  pRVar6 = ScriptContext::GetRecycler((ScriptContext *)__tag.entry.next);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_e0,(type_info *)&RuntimeFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
             ,0x84);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_e0);
  this_00 = (RuntimeFunction *)
            new<(Memory::ObjectInfoBits)1>
                      (0x40,pRVar6,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)((long)&obj + 7));
  RuntimeFunction::RuntimeFunction(this_00,(DynamicType *)revoker,(FunctionInfo *)EntryInfo::Revoke)
  ;
  local_b8 = this_00;
  pvVar7 = TaggedInt::ToVarUnchecked(2);
  (*(this_00->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (this_00,0xd1,pvVar7,2,0,0,0xf);
  (*(local_b8->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x19])
            (local_b8,0xd,local_90,8,0);
  this_01 = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
  object = JavascriptLibrary::CreateObject(this_01,true,2);
  Js::JavascriptOperators::SetProperty
            (object,&object->super_RecyclableObject,0x125,local_90,(ScriptContext *)__tag.entry.next
             ,PropertyOperation_None);
  Js::JavascriptOperators::SetProperty
            (object,&object->super_RecyclableObject,0x138,local_b8,(ScriptContext *)__tag.entry.next
             ,PropertyOperation_None);
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_70);
  return object;
}

Assistant:

Var JavascriptProxy::EntryRevocable(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Proxy.revocable"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Proxy.revocable"));
        }

        JavascriptProxy* proxy = JavascriptProxy::Create(scriptContext, args);
        JavascriptLibrary* library = scriptContext->GetLibrary();
        DynamicType* type = library->CreateFunctionWithConfigurableLengthType(&EntryInfo::Revoke);
        RuntimeFunction* revoker = RecyclerNewEnumClass(scriptContext->GetRecycler(),
            JavascriptLibrary::EnumFunctionClass, RuntimeFunction,
            type, &EntryInfo::Revoke);

        revoker->SetPropertyWithAttributes(Js::PropertyIds::length, Js::TaggedInt::ToVarUnchecked(2), PropertyConfigurable, NULL);
        revoker->SetInternalProperty(Js::InternalPropertyIds::RevocableProxy, proxy, PropertyOperationFlags::PropertyOperation_Force, nullptr);

        DynamicObject* obj = scriptContext->GetLibrary()->CreateObject(true, 2);
        JavascriptOperators::SetProperty(obj, obj, PropertyIds::proxy, proxy, scriptContext);
        JavascriptOperators::SetProperty(obj, obj, PropertyIds::revoke, revoker, scriptContext);
        return obj;
    }